

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlb_helper.c
# Opt level: O1

void arm_cpu_do_unaligned_access_arm
               (CPUState *cs,vaddr vaddr,MMUAccessType access_type,int mmu_idx,uintptr_t retaddr)

{
  ARMCPU *cpu;
  ARMMMUFaultInfo fi;
  ARMMMUFaultInfo local_48;
  
  local_48.type = ARMFault_None;
  local_48.s2addr = 0;
  local_48.level = 0;
  local_48.domain = 0;
  local_48.stage2 = false;
  local_48.s1ptw = false;
  local_48.ea = false;
  local_48._19_1_ = 0;
  cpu_restore_state_arm(cs,retaddr,true);
  local_48.type = ARMFault_Alignment;
  arm_deliver_fault((ARMCPU *)cs,vaddr,access_type,mmu_idx,&local_48);
}

Assistant:

void arm_cpu_do_unaligned_access(CPUState *cs, vaddr vaddr,
                                 MMUAccessType access_type,
                                 int mmu_idx, uintptr_t retaddr)
{
    ARMCPU *cpu = ARM_CPU(cs);
    ARMMMUFaultInfo fi = { 0 };

    /* now we have a real cpu fault */
    cpu_restore_state(cs, retaddr, true);

    fi.type = ARMFault_Alignment;
    arm_deliver_fault(cpu, vaddr, access_type, mmu_idx, &fi);
}